

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * columnTypeImpl(NameContext *pNC,Expr *pExpr)

{
  short sVar1;
  SrcList *pSVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 *puVar6;
  long lVar7;
  Expr *pExpr_00;
  long lVar8;
  NameContext sNC;
  NameContext local_40;
  
  if (pExpr->op == '\x7f') {
    local_40.pSrcList = ((pExpr->x).pSelect)->pSrc;
    pExpr_00 = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
LAB_0015cede:
    local_40.pParse = pNC->pParse;
    local_40.pNext = pNC;
    pcVar4 = columnTypeImpl(&local_40,pExpr_00);
  }
  else {
    if ((pExpr->op == 0x9e) && (pNC != (NameContext *)0x0)) {
      sVar1 = pExpr->iColumn;
      uVar3 = (uint)sVar1;
      puVar6 = (undefined8 *)0x0;
      do {
        pSVar2 = pNC->pSrcList;
        if (0 < (long)pSVar2->nSrc) {
          lVar8 = 0;
          do {
            if (*(int *)((long)&pSVar2->a[0].iCursor + lVar8) == pExpr->iTable) {
              lVar7 = *(long *)((long)&pSVar2->a[0].pTab + lVar8);
              puVar6 = *(undefined8 **)((long)&pSVar2->a[0].pSelect + lVar8);
              goto LAB_0015ce8c;
            }
            lVar8 = lVar8 + 0x70;
          } while ((long)pSVar2->nSrc * 0x70 - lVar8 != 0);
        }
        pNC = pNC->pNext;
        lVar7 = 0;
LAB_0015ce8c:
      } while ((pNC != (NameContext *)0x0) && (lVar7 == 0));
      if (lVar7 != 0) {
        if (puVar6 == (undefined8 *)0x0) {
          if (sVar1 < 0) {
            return "INTEGER";
          }
          lVar8 = (ulong)uVar3 * 0x20;
          if ((*(byte *)(*(long *)(lVar7 + 8) + 0x1b + lVar8) & 4) != 0) {
            pcVar4 = *(char **)(*(long *)(lVar7 + 8) + lVar8);
            sVar5 = strlen(pcVar4);
            return pcVar4 + sVar5 + 1;
          }
        }
        else if ((-1 < sVar1) && ((int)uVar3 < *(int *)*puVar6)) {
          pExpr_00 = *(Expr **)((int *)*puVar6 + (ulong)uVar3 * 8 + 2);
          local_40.pSrcList = (SrcList *)puVar6[5];
          goto LAB_0015cede;
        }
      }
    }
    pcVar4 = (char *)0x0;
  }
  return pcVar4;
}

Assistant:

static const char *columnTypeImpl(
  NameContext *pNC, 
#ifndef SQLITE_ENABLE_COLUMN_METADATA
  Expr *pExpr
#else
  Expr *pExpr,
  const char **pzOrigDb,
  const char **pzOrigTab,
  const char **pzOrigCol
#endif
){
  char const *zType = 0;
  int j;
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  char const *zOrigDb = 0;
  char const *zOrigTab = 0;
  char const *zOrigCol = 0;
#endif

  assert( pExpr!=0 );
  assert( pNC->pSrcList!=0 );
  assert( pExpr->op!=TK_AGG_COLUMN );  /* This routine runes before aggregates
                                       ** are processed */
  switch( pExpr->op ){
    case TK_COLUMN: {
      /* The expression is a column. Locate the table the column is being
      ** extracted from in NameContext.pSrcList. This table may be real
      ** database table or a subquery.
      */
      Table *pTab = 0;            /* Table structure column is extracted from */
      Select *pS = 0;             /* Select the column is extracted from */
      int iCol = pExpr->iColumn;  /* Index of column in pTab */
      while( pNC && !pTab ){
        SrcList *pTabList = pNC->pSrcList;
        for(j=0;j<pTabList->nSrc && pTabList->a[j].iCursor!=pExpr->iTable;j++);
        if( j<pTabList->nSrc ){
          pTab = pTabList->a[j].pTab;
          pS = pTabList->a[j].pSelect;
        }else{
          pNC = pNC->pNext;
        }
      }

      if( pTab==0 ){
        /* At one time, code such as "SELECT new.x" within a trigger would
        ** cause this condition to run.  Since then, we have restructured how
        ** trigger code is generated and so this condition is no longer 
        ** possible. However, it can still be true for statements like
        ** the following:
        **
        **   CREATE TABLE t1(col INTEGER);
        **   SELECT (SELECT t1.col) FROM FROM t1;
        **
        ** when columnType() is called on the expression "t1.col" in the 
        ** sub-select. In this case, set the column type to NULL, even
        ** though it should really be "INTEGER".
        **
        ** This is not a problem, as the column type of "t1.col" is never
        ** used. When columnType() is called on the expression 
        ** "(SELECT t1.col)", the correct type is returned (see the TK_SELECT
        ** branch below.  */
        break;
      }

      assert( pTab && pExpr->y.pTab==pTab );
      if( pS ){
        /* The "table" is actually a sub-select or a view in the FROM clause
        ** of the SELECT statement. Return the declaration type and origin
        ** data for the result-set column of the sub-select.
        */
        if( iCol>=0 && iCol<pS->pEList->nExpr ){
          /* If iCol is less than zero, then the expression requests the
          ** rowid of the sub-select or view. This expression is legal (see 
          ** test case misc2.2.2) - it always evaluates to NULL.
          */
          NameContext sNC;
          Expr *p = pS->pEList->a[iCol].pExpr;
          sNC.pSrcList = pS->pSrc;
          sNC.pNext = pNC;
          sNC.pParse = pNC->pParse;
          zType = columnType(&sNC, p,&zOrigDb,&zOrigTab,&zOrigCol); 
        }
      }else{
        /* A real table or a CTE table */
        assert( !pS );
#ifdef SQLITE_ENABLE_COLUMN_METADATA
        if( iCol<0 ) iCol = pTab->iPKey;
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
          zOrigCol = "rowid";
        }else{
          zOrigCol = pTab->aCol[iCol].zName;
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
        zOrigTab = pTab->zName;
        if( pNC->pParse && pTab->pSchema ){
          int iDb = sqlite3SchemaToIndex(pNC->pParse->db, pTab->pSchema);
          zOrigDb = pNC->pParse->db->aDb[iDb].zDbSName;
        }
#else
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
        }else{
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
#endif
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT: {
      /* The expression is a sub-select. Return the declaration type and
      ** origin info for the single column in the result set of the SELECT
      ** statement.
      */
      NameContext sNC;
      Select *pS = pExpr->x.pSelect;
      Expr *p = pS->pEList->a[0].pExpr;
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );
      sNC.pSrcList = pS->pSrc;
      sNC.pNext = pNC;
      sNC.pParse = pNC->pParse;
      zType = columnType(&sNC, p, &zOrigDb, &zOrigTab, &zOrigCol); 
      break;
    }
#endif
  }

#ifdef SQLITE_ENABLE_COLUMN_METADATA  
  if( pzOrigDb ){
    assert( pzOrigTab && pzOrigCol );
    *pzOrigDb = zOrigDb;
    *pzOrigTab = zOrigTab;
    *pzOrigCol = zOrigCol;
  }
#endif
  return zType;
}